

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::RoaringScanState::ScanPartial
          (RoaringScanState *this,idx_t start_idx,Vector *result,idx_t offset,idx_t count)

{
  ContainerScanState *pCVar1;
  ulong uVar2;
  long lVar3;
  
  Vector::Flatten(result,count);
  if (count != 0) {
    lVar3 = 0;
    do {
      pCVar1 = LoadContainer(this,lVar3 + start_idx >> 0xb,
                             (ulong)((uint)(lVar3 + start_idx) & 0x7ff));
      uVar2 = pCVar1->container_size - pCVar1->scanned_count;
      if (count < uVar2) {
        uVar2 = count;
      }
      (*pCVar1->_vptr_ContainerScanState[2])(pCVar1,result,lVar3 + offset,uVar2);
      lVar3 = lVar3 + uVar2;
      count = count - uVar2;
    } while (count != 0);
  }
  return;
}

Assistant:

void RoaringScanState::ScanPartial(idx_t start_idx, Vector &result, idx_t offset, idx_t count) {
	result.Flatten(count);
	idx_t remaining = count;
	idx_t scanned = 0;
	while (remaining) {
		idx_t internal_offset;
		idx_t container_idx = GetContainerIndex(start_idx + scanned, internal_offset);
		auto &scan_state = LoadContainer(container_idx, internal_offset);
		idx_t remaining_in_container = scan_state.container_size - scan_state.scanned_count;
		idx_t to_scan = MinValue<idx_t>(remaining, remaining_in_container);
		ScanInternal(scan_state, to_scan, result, offset + scanned);
		remaining -= to_scan;
		scanned += to_scan;
	}
	D_ASSERT(scanned == count);
}